

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O1

void __thiscall cplus::utils::List<int>::~List(List<int> *this)

{
  ListPoint *pLVar1;
  ListPoint *pLVar2;
  ListPoint *pLVar3;
  
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_toString_00124110;
  pLVar3 = this->listBegin;
  this->state = pLVar3;
  this->preview = this->listEnd;
  if (pLVar3 != this->listEnd) {
    do {
      pLVar1 = pLVar3->nextAndPrev;
      pLVar2 = this->preview;
      this->preview = pLVar3;
      this->state = (ListPoint *)((ulong)pLVar1 ^ (ulong)pLVar2);
      if (pLVar3 != (ListPoint *)0x0) {
        operator_delete(pLVar3);
      }
      pLVar3 = this->state;
    } while (pLVar3 != this->listEnd);
  }
  if (pLVar3 != (ListPoint *)0x0) {
    operator_delete(pLVar3);
  }
  if (this->array != (int *)0x0) {
    operator_delete__(this->array);
    return;
  }
  return;
}

Assistant:

~List() {
				reset(); //指针复位
				while (state != listEnd) {
					next(); //next只调用state的函数，对于上一个元素只需要地址即可
					delete preview; //删除上一个元素
				}
				if (state != nullptr)delete state; //遍历所有元素
				if (array != nullptr) delete[] array;
			}